

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketsOps.cpp
# Opt level: O1

sz_event sznet::net::sockets::sz_create_eventfd(void)

{
  int iVar1;
  SourceFile file;
  Logger local_fe0;
  
  iVar1 = eventfd(0,0x80800);
  if (-1 < iVar1) {
    return iVar1;
  }
  file._8_8_ = 0xe;
  file.m_data = "SocketsOps.cpp";
  Logger::Logger(&local_fe0,file,0x1f7,false);
  LogStream::operator<<(&local_fe0.m_impl.m_stream,"Failed in eventfd");
  Logger::~Logger(&local_fe0);
  abort();
}

Assistant:

sz_event sz_create_eventfd()
{
	int evtfd = ::eventfd(0, EFD_NONBLOCK | EFD_CLOEXEC);
	if (evtfd < 0)
	{
		LOG_SYSERR << "Failed in eventfd";
		abort();
	}

	return evtfd;
}